

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ParseTag(TidyDocImpl *doc,Node *node,GetTokenMode mode)

{
  Lexer *pLVar1;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if (node->tag != (Dict *)0x0) {
    if ((node->tag->model & 1) == 0) {
      if ((node->tag->model & 0x10) == 0) {
        pLVar1->insertspace = no;
      }
    }
    else {
      pLVar1->waswhite = no;
      if (node->tag->parser == (Parser *)0x0) {
        return;
      }
    }
    if ((node->tag->parser != (Parser *)0x0) && (node->type != StartEndTag)) {
      pLVar1->parent = node;
      (*node->tag->parser)(doc,node,mode);
    }
  }
  return;
}

Assistant:

static void ParseTag( TidyDocImpl* doc, Node *node, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;

    if (node->tag == NULL) /* [i_a]2 prevent crash for active content (php, asp) docs */
        return;

    /*
       Fix by GLP 2000-12-21.  Need to reset insertspace if this 
       is both a non-inline and empty tag (base, link, meta, isindex, hr, area).
    */
    if (node->tag->model & CM_EMPTY)
    {
        lexer->waswhite = no;
        if (node->tag->parser == NULL)
            return;
    }
    else if (!(node->tag->model & CM_INLINE))
        lexer->insertspace = no;

    if (node->tag->parser == NULL)
        return;

    if (node->type == StartEndTag)
        return;

    lexer->parent = node; /* [i_a]2 added this - not sure why - CHECKME: */

    (*node->tag->parser)( doc, node, mode );
}